

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

int xmlXIncludeProcessFlagsData(xmlDocPtr doc,int flags,void *data)

{
  xmlNodePtr tree_00;
  xmlNodePtr tree;
  void *data_local;
  int flags_local;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local._4_4_ = -1;
  }
  else {
    tree_00 = xmlDocGetRootElement(doc);
    if (tree_00 == (xmlNodePtr)0x0) {
      doc_local._4_4_ = -1;
    }
    else {
      doc_local._4_4_ = xmlXIncludeProcessTreeFlagsData(tree_00,flags,data);
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlXIncludeProcessFlagsData(xmlDocPtr doc, int flags, void *data) {
    xmlNodePtr tree;

    if (doc == NULL)
	return(-1);
    tree = xmlDocGetRootElement(doc);
    if (tree == NULL)
	return(-1);
    return(xmlXIncludeProcessTreeFlagsData(tree, flags, data));
}